

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
despot::Function::SetValue
          (Function *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,int key_pos,int pid,int cid,vector<double,_std::allocator<double>_> *values,
          int start,int end)

{
  double dVar1;
  pointer ppNVar2;
  pointer pvVar3;
  pointer pbVar4;
  NamedVar *this_00;
  pointer pcVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  NamedVar **ppNVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  int iVar13;
  ulong uVar14;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_01;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar19;
  int cid_local;
  Function *local_60;
  long local_58;
  string local_50;
  
  lVar17 = (long)key_pos;
  ppNVar2 = (this->parents_).
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  cid_local = cid;
  if (((long)(this->parents_).
             super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3) + 1 == lVar17) {
    if (end + -1 != start) {
      __assert_fail("start == end - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                    ,0x26,
                    "bool despot::Function::SetValue(vector<string> &, int, int, int, const vector<double> &, int, int)"
                   );
    }
    pvVar3 = (this->values_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[start];
    if ((this->values_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar3) {
      this_01 = &(this->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pid]._M_t;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pmVar11 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              *)this_01,&cid_local);
        *pmVar11 = dVar1;
      }
      else {
        pVar19 = std::
                 _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 ::equal_range(this_01,&cid_local);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_M_erase_aux(this_01,(_Base_ptr)pVar19.first._M_node,(_Base_ptr)pVar19.second._M_node);
      }
    }
    else {
      pvVar3[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[cid] = dVar1;
    }
  }
  else {
    pbVar4 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppNVar10 = ppNVar2 + lVar17;
    if (((long)(keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) + -1 == lVar17) {
      ppNVar10 = &this->child_;
    }
    this_00 = *ppNVar10;
    local_58 = lVar17;
    iVar9 = std::__cxx11::string::compare((char *)(pbVar4 + lVar17));
    local_60 = this;
    if (iVar9 != 0) {
      iVar9 = std::__cxx11::string::compare
                        ((char *)((keys->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar17));
      if (iVar9 == 0) {
        pbVar4 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar6 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          uVar14 = (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          bVar8 = uVar14 <= uVar18;
          if (uVar14 <= uVar18) {
            return bVar8;
          }
          iVar16 = (int)uVar18;
          iVar13 = (int)uVar14 * pid + iVar16;
          iVar9 = cid;
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 == local_58) {
            iVar13 = pid;
            iVar9 = iVar16;
          }
          iVar15 = (int)((ulong)(long)(end - start) / (ulong)((long)pbVar4 - (long)pbVar6 >> 5));
          uVar18 = uVar18 + 1;
          bVar7 = SetValue(local_60,keys,key_pos + 1,iVar13,iVar9,values,iVar16 * iVar15 + start,
                           (int)uVar18 * iVar15 + start);
        } while (bVar7);
        return bVar8;
      }
      pbVar4 = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar5 = pbVar4[lVar17]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar5,pcVar5 + pbVar4[lVar17]._M_string_length);
      iVar9 = Variable::IndexOf(&this_00->super_Variable,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (-1 < iVar9) {
        if (((long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 != local_58) {
          pid = (int)((ulong)((long)(this_00->super_Variable).values_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) * pid + iVar9;
          iVar9 = cid;
        }
        bVar8 = SetValue(this,keys,key_pos + 1,pid,iVar9,values,start,end);
        return bVar8;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      pbVar4 = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pbVar4[lVar17]._M_dataplus._M_p,
                           pbVar4[lVar17]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," is not in the domain of ",0x19);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(this_00->name_)._M_dataplus._M_p,
                           (this_00->name_)._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      return false;
    }
    lVar17 = (long)(this_00->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar17 != 0) {
      uVar18 = lVar17 >> 5;
      uVar14 = 0;
      while( true ) {
        iVar13 = (int)uVar18 * pid + (int)uVar14;
        iVar9 = cid;
        if (((long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 == local_58) {
          iVar13 = pid;
          iVar9 = (int)uVar14;
        }
        bVar8 = SetValue(local_60,keys,key_pos + 1,iVar13,iVar9,values,start,end);
        if (!bVar8) break;
        uVar14 = uVar14 + 1;
        uVar18 = (long)(this_00->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar18 <= uVar14) {
          return bVar8;
        }
      }
      return bVar8;
    }
  }
  return true;
}

Assistant:

bool Function::SetValue(vector<string>& keys, int key_pos, int pid, int cid,
	const vector<double>& values, int start, int end) {
	if (key_pos == parents_.size() + 1) {
		assert(start == end - 1);

		if (values_.size() > 0) // TODO: possible refactoring to use a single data structure
			values_[pid][cid] = values[start];
		else {
			if (values[start] != 0.0) {
				map_[pid][cid] = values[start];
			} else {
				map_[pid].erase(cid);
			}
		}

		return true;
	} else {
		NamedVar* curr =
			(key_pos == keys.size() - 1) ? child_ : parents_[key_pos];
		const vector<string>& dom = curr->values();

		if (keys[key_pos] == "*") {
			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start, end))
					return false;
			}
			return true;
		} else if (keys[key_pos] == "-") {
			int block_size = (end - start) / curr->values().size();

			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start + i * block_size, start + (i + 1) * block_size))
					return false;
			}
			return true;
		} else {
			int id = curr->IndexOf(keys[key_pos]);
			if (id < 0) {
				cerr << "ERROR: " << keys[key_pos]
					<< " is not in the domain of " << curr->name() << endl;
				return false;
			}

			if (key_pos == keys.size() - 1)
				cid = id;
			else
				pid = pid * dom.size() + id;

			return SetValue(keys, key_pos + 1, pid, cid, values, start, end);
		}
	}
}